

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O0

void __thiscall cmCTestSubmitCommand::CheckArguments(cmCTestSubmitCommand *this)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  cmCTestSubmitCommand *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->Parts);
  if (bVar1) {
    pvVar2 = &std::
              optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator*(&this->Parts)->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    ::cm::
    erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmCTestSubmitCommand::CheckArguments()::__0>
              (pvVar2,(anon_class_8_1_8991fb9c_for__M_pred)this);
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->Files);
  if (bVar1) {
    pvVar2 = &std::
              optional<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator*(&this->Files)->
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    ::cm::
    erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmCTestSubmitCommand::CheckArguments()::__1>
              (pvVar2,(anon_class_8_1_8991fb9c_for__M_pred)this);
  }
  return;
}

Assistant:

void cmCTestSubmitCommand::CheckArguments()
{
  if (this->Parts) {
    cm::erase_if(*(this->Parts), [this](std::string const& arg) -> bool {
      cmCTest::Part p = this->CTest->GetPartFromName(arg);
      if (p == cmCTest::PartCount) {
        std::ostringstream e;
        e << "Part name \"" << arg << "\" is invalid.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return true;
      }
      return false;
    });
  }

  if (this->Files) {
    cm::erase_if(*(this->Files), [this](std::string const& arg) -> bool {
      if (!cmSystemTools::FileExists(arg)) {
        std::ostringstream e;
        e << "File \"" << arg << "\" does not exist. Cannot submit "
          << "a non-existent file.";
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        return true;
      }
      return false;
    });
  }
}